

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<Fad<double>_>::Print
          (TPZMatrix<Fad<double>_> *this,char *name,ostream *out,MatrixOutputFormat form)

{
  ostream *poVar1;
  ostream *in_RDX;
  char *in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  int64_t j;
  int64_t i;
  Fad<double> *this_00;
  Fad<double> *in_stack_fffffffffffffe98;
  ostream *in_stack_fffffffffffffea0;
  Fad<double> local_50;
  long local_30;
  long local_28;
  ostream *local_18;
  
  local_18 = in_RDX;
  poVar1 = std::operator<<(in_RDX,in_RSI);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_28 = 0; local_28 < in_RDI[1]; local_28 = local_28 + 1) {
    for (local_30 = 0; local_30 < in_RDI[2]; local_30 = local_30 + 1) {
      poVar1 = std::operator<<(local_18,"i = ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_28);
      poVar1 = std::operator<<(poVar1," j = ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_30);
      poVar1 = std::operator<<(poVar1," val ");
      this_00 = &local_50;
      (**(code **)(*in_RDI + 0x108))(this_00,in_RDI,local_28,local_30,in_R8,in_R9,poVar1);
      poVar1 = ::operator<<(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      Fad<double>::~Fad(this_00);
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Print(const char *name, std::ostream& out,const MatrixOutputFormat form) const {
    if constexpr (std::is_same<TVar, TFad<6, REAL>>::value ||
                  std::is_same<TVar, Fad<float>>::value ||
                  std::is_same<TVar, Fad<double>>::value ||
                  std::is_same<TVar, Fad<long double>>::value) {
        out << name << std::endl;
        for (int64_t i = 0; i < fRow; i++) {
            for (int64_t j = 0; j < fCol; j++) {
                out << "i = " << i << " j = " << j << " val " << Get(i, j) << std::endl;
            }
        }
        return;
   
    }
    //getting current settings of std::ostream instance
    std::ios cout_state(nullptr);
    cout_state.copyfmt(out);

    typedef std::numeric_limits< RTVar > typlim;
    out << std::setprecision(typlim::max_digits10);

    const auto nrows = Rows();
    const auto ncols = Cols();
    
    if(form == EFormatted) {
        out << "Writing matrix '";
        if(name) out << name;
        out << "' (" << nrows << " x " << ncols << "):\n";
		
        for ( int64_t row = 0; row < nrows; row++) {
            out << "\t";
            for ( int64_t col = 0; col < ncols; col++ ) {
                out << GetVal( row, col) << "  ";//complex numbers are (a,b)
            }
            out << "\n";
        }
        out << "\n";
    } else if (form == EFixedColumn) {
        out << "Writing matrix '";
        if(name) out << name;
        out << "' (" << nrows << " x " << ncols << "):\n";
        TVar value;
        constexpr int columnlength = typlim::max_digits10;

        auto PrintVal = [columnlength](std::ostream &out, RTVar val){
            if(val<0.) {
                out << std::setw(columnlength+1) << std::left << val << " ";
            }else{
                out << " ";
                out << std::setw(columnlength)   << std::left << val << " ";
            }
        };
        
        for ( int64_t row = 0; row < nrows; row++) {
            for ( int64_t col = 0; col < ncols; col++ ) {
                value = Get( row, col);
                if constexpr (std::is_same_v<RTVar,TVar>){
                    PrintVal(out,value);
                }else{
                    out<<"(";
                    PrintVal(out,value.real());
                    out<<",";
                    PrintVal(out,value.imag());
                    out<<")";
                }
            }
            out << "\n";
        }
        out << "\n";
    } else if (form == EInputFormat) {
        out << nrows << " " << ncols << endl;
        for ( int64_t row = 0; row < nrows; row++) {
            for ( int64_t col = 0; col < ncols; col++ ) {
                const TVar val = GetVal(row, col);
                if(val != (TVar)0.) out << row << ' ' << col << ' ' << val << std::endl;
            }
        }
        out << "-1 -1 0.\n";
    } else if( form == EMathematicaInput)
        {
            
            out << name << "\n{ ";
            for ( int64_t row = 0; row < nrows; row++) {
                out << "\n{ ";
                for ( int64_t col = 0; col < ncols; col++ ) {
                    const TVar val = GetVal(row, col);
                    if constexpr (std::is_same_v<TVar,RTVar>){
                        out << val;
                    }else{
                        out << val.real() << "+I"<<val.imag();
                    }
                    if(col < ncols-1)
                        out << ", ";
                    if((col+1) % 6 == 0) out << '\n';
                }
                out << " }";
                if(row < nrows-1)
                    out << ",";
            }
		
            out << " };"<<std::endl;
		
        }else if( form == ECSV)
        {
         
            for ( int64_t row = 0; row < nrows; row++) {
                for ( int64_t col = 0; col < ncols; col++ ) {
                    const TVar val = GetVal(row, col);
                    if constexpr (std::is_same_v<TVar,RTVar>){
                        out << val;
                    }else{
                        const auto signchar = val.imag() > 0 ? '+' : '-';
                        out << val.real() <<signchar<<std::fabs(val.imag())<<"j";
                    }
                    if(col < ncols-1)  out << " , ";
                }
                if(row < nrows-1)
                    out << "\n";
            }

        } else if( form == EMatlabNonZeros)
        {
            out << name;
            for ( int64_t row = 0; row < nrows; row++) {
                out << "\n|";
                for ( int64_t col = 0; col < ncols; col++ )
                    if(IsZero(GetVal(row, col)) ){
                        out << ".";
                    }else{
                        out << "#";
                    }
                out << "|";
            }
            out << "\n";
        }
    else if( form == EMatrixMarket)
        {
            bool sym = IsSymmetric();
            int64_t numzero = 0;
            int64_t nrow = nrows;
            for ( int64_t row = 0; row < nrows; row++) {
                int64_t colmax = nrow;
                if (sym) colmax = row+1;
                for (int64_t col = 0; col < colmax; col++ )
                    {
                        TVar val = GetVal(row, col);
                        if (val != (TVar)0.) {
                            numzero++;
                        }
                    }
            }
            out << "%%"<< name << std::endl;
            out << nrows << ' ' << ncols << ' ' << numzero << std::endl;
            for ( int64_t row = 0; row < nrows; row++) {
                int64_t colmax = nrow;
                if (sym) colmax = row+1;
                for (int64_t col = 0; col < colmax; col++ )
                    {
                        const TVar val = GetVal(row, col);
                        if (val != (TVar)0.) {
                            out << row+1 << ' ' << col+1 << ' ' << val << '\n';
                        }
                    }
            }
        }
    //restore precision
    out.copyfmt(cout_state);
}